

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O3

void __thiscall
FunctionTable::SetTermBottomLabel(FunctionTable *this,string *func_name,string *bottom_label)

{
  undefined1 *puVar1;
  int iVar2;
  pointer pFVar3;
  string *psVar4;
  bool bVar5;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pFVar3 = (this->m_func_table).
           super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar3 != (this->m_func_table).
                super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    psVar4 = (string *)&pFVar3->m_bottom_label;
    do {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(psVar4 + -0x40),
                 *(long *)(psVar4 + -0x38) + *(long *)(psVar4 + -0x40));
      puVar1 = local_50;
      if (local_48 == func_name->_M_string_length) {
        if (local_48 == 0) {
          bVar5 = true;
        }
        else {
          iVar2 = bcmp(local_50,(func_name->_M_dataplus)._M_p,local_48);
          bVar5 = iVar2 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (puVar1 != local_40) {
        operator_delete(puVar1);
      }
      if (bVar5) {
        std::__cxx11::string::_M_assign(psVar4);
      }
      pFVar3 = (pointer)(psVar4 + 0x48);
      psVar4 = psVar4 + 0x88;
    } while (pFVar3 != (this->m_func_table).
                       super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void FunctionTable::SetTermBottomLabel(const string& func_name, const string& bottom_label) {
    auto iter = m_func_table.begin();
    for (; iter != m_func_table.end(); ++iter) {
        if (iter->GetName() == func_name) {
            iter->SetBottomLabel(bottom_label);
        }
    }
}